

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetAdaptivityMethod
              (void *arkode_mem,int imethod,int idefault,int pq,sunrealtype *adapt_params)

{
  int iVar1;
  SUNContext_conflict sunctx;
  int in_ECX;
  int in_EDX;
  uint in_ESI;
  ARKodeMem in_RDI;
  sunrealtype *in_R8;
  SUNAdaptController C;
  ARKodeMem ark_mem;
  sunrealtype k3;
  sunrealtype k2;
  sunrealtype k1;
  long leniw;
  long lenrw;
  int retval;
  SUNAdaptController local_68;
  sunrealtype local_58;
  sunrealtype local_50;
  sunrealtype local_48;
  long local_40;
  long local_38;
  int local_2c;
  sunrealtype *local_28;
  int local_1c;
  int local_18;
  uint local_14;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0xbdd,"arkSetAdaptivityMethod",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if ((in_EDX == 1) || (in_R8 != (sunrealtype *)0x0)) {
    local_28 = in_R8;
    local_1c = in_ECX;
    local_18 = in_EDX;
    local_14 = in_ESI;
    local_2c = SUNAdaptController_Space(in_RDI->hadapt_mem->hcontroller,&local_38,&local_40);
    if (local_2c == 0) {
      in_RDI->liw = in_RDI->liw - local_40;
      in_RDI->lrw = in_RDI->lrw - local_38;
    }
    if (in_RDI->hadapt_mem->owncontroller != 0) {
      local_2c = SUNAdaptController_Destroy(in_RDI->hadapt_mem->hcontroller);
      in_RDI->hadapt_mem->owncontroller = 0;
      if (local_2c != 0) {
        arkProcessError(in_RDI,-0x14,0xbfa,"arkSetAdaptivityMethod",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                        ,"SUNAdaptController_Destroy failure");
        return -0x14;
      }
      local_2c = 0;
    }
    in_RDI->hadapt_mem->hcontroller = (SUNAdaptController)0x0;
    local_58 = 0.0;
    local_50 = 0.0;
    local_48 = 0.0;
    if (local_18 != 1) {
      local_48 = *local_28;
      local_50 = local_28[1];
      local_58 = local_28[2];
    }
    in_RDI->hadapt_mem->pq = local_1c;
    sunctx = (SUNContext_conflict)(ulong)local_14;
    switch(sunctx) {
    case (SUNContext_conflict)0x0:
      local_68 = SUNAdaptController_PID(sunctx);
      if (local_68 == (SUNAdaptController)0x0) {
        arkProcessError(in_RDI,-0x14,0xc14,"arkSetAdaptivityMethod",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                        ,"SUNAdaptController_PID allocation failure");
        return -0x14;
      }
      if (local_18 != 1) {
        local_2c = SUNAdaptController_SetParams_PID(local_68,local_48,-local_50,local_58);
        if (local_2c != 0) {
          SUNAdaptController_Destroy(local_68);
          arkProcessError(in_RDI,-0x2f,0xc1e,"arkSetAdaptivityMethod",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                          ,"SUNAdaptController_SetParams_PID failure");
          return -0x2f;
        }
        local_2c = 0;
      }
      break;
    case (SUNContext_conflict)0x1:
      local_68 = SUNAdaptController_PI(sunctx);
      if (local_68 == (SUNAdaptController)0x0) {
        arkProcessError(in_RDI,-0x14,0xc28,"arkSetAdaptivityMethod",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                        ,"SUNAdaptController_PI allocation failure");
        return -0x14;
      }
      if (local_18 != 1) {
        local_2c = SUNAdaptController_SetParams_PI(local_68,local_48,-local_50);
        if (local_2c != 0) {
          SUNAdaptController_Destroy(local_68);
          arkProcessError(in_RDI,-0x2f,0xc32,"arkSetAdaptivityMethod",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                          ,"SUNAdaptController_SetParams_PI failure");
          return -0x2f;
        }
        local_2c = 0;
      }
      break;
    case (SUNContext_conflict)0x2:
      local_68 = SUNAdaptController_I(sunctx);
      if (local_68 == (SUNAdaptController)0x0) {
        arkProcessError(in_RDI,-0x14,0xc3c,"arkSetAdaptivityMethod",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                        ,"SUNAdaptController_I allocation failure");
        return -0x14;
      }
      if (local_18 != 1) {
        local_2c = SUNAdaptController_SetParams_I(local_68,local_48);
        if (local_2c != 0) {
          SUNAdaptController_Destroy(local_68);
          arkProcessError(in_RDI,-0x2f,0xc46,"arkSetAdaptivityMethod",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                          ,"SUNAdaptController_SetParams_I failure");
          return -0x2f;
        }
        local_2c = 0;
      }
      break;
    case (SUNContext_conflict)0x3:
      local_68 = SUNAdaptController_ExpGus(sunctx);
      if (local_68 == (SUNAdaptController)0x0) {
        arkProcessError(in_RDI,-0x14,0xc50,"arkSetAdaptivityMethod",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                        ,"SUNAdaptController_ExpGus allocation failure");
        return -0x14;
      }
      if (local_18 != 1) {
        local_2c = SUNAdaptController_SetParams_ExpGus(local_68,local_48,local_50);
        if (local_2c != 0) {
          SUNAdaptController_Destroy(local_68);
          arkProcessError(in_RDI,-0x2f,0xc5a,"arkSetAdaptivityMethod",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                          ,"SUNAdaptController_SetParams_ExpGus failure");
          return -0x2f;
        }
        local_2c = 0;
      }
      break;
    case (SUNContext_conflict)0x4:
      local_68 = SUNAdaptController_ImpGus(sunctx);
      if (local_68 == (SUNAdaptController)0x0) {
        arkProcessError(in_RDI,-0x14,0xc64,"arkSetAdaptivityMethod",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                        ,"SUNAdaptController_ImpGus allocation failure");
        return -0x14;
      }
      if (local_18 != 1) {
        local_2c = SUNAdaptController_SetParams_ImpGus(local_68,local_48,local_50);
        if (local_2c != 0) {
          SUNAdaptController_Destroy(local_68);
          arkProcessError(in_RDI,-0x2f,0xc6e,"arkSetAdaptivityMethod",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                          ,"SUNAdaptController_SetParams_ImpGus failure");
          return -0x2f;
        }
        local_2c = 0;
      }
      break;
    case (SUNContext_conflict)0x5:
      local_68 = SUNAdaptController_ImExGus((SUNContext_conflict)in_RDI);
      if (local_68 == (SUNAdaptController)0x0) {
        arkProcessError(in_RDI,-0x14,0xc78,"arkSetAdaptivityMethod",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                        ,"SUNAdaptController_ImExGus allocation failure");
        return -0x14;
      }
      if (local_18 != 1) {
        local_2c = SUNAdaptController_SetParams_ImExGus
                             (local_68,local_48,local_50,local_58,local_58);
        if (local_2c != 0) {
          SUNAdaptController_Destroy(local_68);
          arkProcessError(in_RDI,-0x2f,0xc82,"arkSetAdaptivityMethod",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                          ,"SUNAdaptController_SetParams_ImExGus failure");
          return -0x2f;
        }
        local_2c = 0;
      }
      break;
    default:
      arkProcessError(in_RDI,-0x16,0xc89,"arkSetAdaptivityMethod",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                      ,"Illegal imethod");
      return -0x16;
    }
    iVar1 = SUNAdaptController_Space(local_68,&local_38,&local_40);
    if (iVar1 == 0) {
      in_RDI->liw = local_40 + in_RDI->liw;
      in_RDI->lrw = local_38 + in_RDI->lrw;
    }
    in_RDI->hadapt_mem->hcontroller = local_68;
    in_RDI->hadapt_mem->owncontroller = 1;
    local_4 = 0;
  }
  else {
    arkProcessError(in_RDI,-0x16,0xbe6,"arkSetAdaptivityMethod",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"NULL-valued adapt_params provided");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int arkSetAdaptivityMethod(void* arkode_mem, int imethod, int idefault, int pq,
                           sunrealtype adapt_params[3])
{
  int retval;
  long int lenrw, leniw;
  sunrealtype k1, k2, k3;
  ARKodeMem ark_mem;
  SUNAdaptController C;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Check for illegal inputs */
  if ((idefault != 1) && (adapt_params == NULL))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NULL-valued adapt_params provided");
    return (ARK_ILL_INPUT);
  }

  /* Remove current SUNAdaptController object
     (delete if owned, and then nullify pointer) */
  retval = SUNAdaptController_Space(ark_mem->hadapt_mem->hcontroller, &lenrw,
                                    &leniw);
  if (retval == SUN_SUCCESS)
  {
    ark_mem->liw -= leniw;
    ark_mem->lrw -= lenrw;
  }
  if (ark_mem->hadapt_mem->owncontroller)
  {
    retval = SUNAdaptController_Destroy(ark_mem->hadapt_mem->hcontroller);
    ark_mem->hadapt_mem->owncontroller = SUNFALSE;
    if (retval != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_Destroy failure");
      return (ARK_MEM_FAIL);
    }
  }
  ark_mem->hadapt_mem->hcontroller = NULL;

  /* set adaptivity parameters from inputs */
  k1 = k2 = k3 = ZERO;
  if (idefault != 1)
  {
    k1 = adapt_params[0];
    k2 = adapt_params[1];
    k3 = adapt_params[2];
  }
  ark_mem->hadapt_mem->pq = pq;

  /* Create new SUNAdaptController object based on "imethod" input, optionally setting
     the specified controller parameters */
  C = NULL;
  switch (imethod)
  {
  case (ARK_ADAPT_PID):
    C = SUNAdaptController_PID(ark_mem->sunctx);
    if (C == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_PID allocation failure");
      return (ARK_MEM_FAIL);
    }
    if (idefault != 1)
    {
      retval = SUNAdaptController_SetParams_PID(C, k1, -k2, k3);
      if (retval != SUN_SUCCESS)
      {
        (void)SUNAdaptController_Destroy(C);
        arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__,
                        __FILE__, "SUNAdaptController_SetParams_PID failure");
        return (ARK_CONTROLLER_ERR);
      }
    }
    break;
  case (ARK_ADAPT_PI):
    C = SUNAdaptController_PI(ark_mem->sunctx);
    if (C == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_PI allocation failure");
      return (ARK_MEM_FAIL);
    }
    if (idefault != 1)
    {
      retval = SUNAdaptController_SetParams_PI(C, k1, -k2);
      if (retval != SUN_SUCCESS)
      {
        (void)SUNAdaptController_Destroy(C);
        arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__,
                        __FILE__, "SUNAdaptController_SetParams_PI failure");
        return (ARK_CONTROLLER_ERR);
      }
    }
    break;
  case (ARK_ADAPT_I):
    C = SUNAdaptController_I(ark_mem->sunctx);
    if (C == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_I allocation failure");
      return (ARK_MEM_FAIL);
    }
    if (idefault != 1)
    {
      retval = SUNAdaptController_SetParams_I(C, k1);
      if (retval != SUN_SUCCESS)
      {
        (void)SUNAdaptController_Destroy(C);
        arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__,
                        __FILE__, "SUNAdaptController_SetParams_I failure");
        return (ARK_CONTROLLER_ERR);
      }
    }
    break;
  case (ARK_ADAPT_EXP_GUS):
    C = SUNAdaptController_ExpGus(ark_mem->sunctx);
    if (C == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_ExpGus allocation failure");
      return (ARK_MEM_FAIL);
    }
    if (idefault != 1)
    {
      retval = SUNAdaptController_SetParams_ExpGus(C, k1, k2);
      if (retval != SUN_SUCCESS)
      {
        (void)SUNAdaptController_Destroy(C);
        arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__,
                        __FILE__, "SUNAdaptController_SetParams_ExpGus failure");
        return (ARK_CONTROLLER_ERR);
      }
    }
    break;
  case (ARK_ADAPT_IMP_GUS):
    C = SUNAdaptController_ImpGus(ark_mem->sunctx);
    if (C == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_ImpGus allocation failure");
      return (ARK_MEM_FAIL);
    }
    if (idefault != 1)
    {
      retval = SUNAdaptController_SetParams_ImpGus(C, k1, k2);
      if (retval != SUN_SUCCESS)
      {
        (void)SUNAdaptController_Destroy(C);
        arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__,
                        __FILE__, "SUNAdaptController_SetParams_ImpGus failure");
        return (ARK_CONTROLLER_ERR);
      }
    }
    break;
  case (ARK_ADAPT_IMEX_GUS):
    C = SUNAdaptController_ImExGus(ark_mem->sunctx);
    if (C == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_ImExGus allocation failure");
      return (ARK_MEM_FAIL);
    }
    if (idefault != 1)
    {
      retval = SUNAdaptController_SetParams_ImExGus(C, k1, k2, k3, k3);
      if (retval != SUN_SUCCESS)
      {
        (void)SUNAdaptController_Destroy(C);
        arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__,
                        __FILE__, "SUNAdaptController_SetParams_ImExGus failure");
        return (ARK_CONTROLLER_ERR);
      }
    }
    break;
  default:
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Illegal imethod");
    return (ARK_ILL_INPUT);
  }

  /* Attach new SUNAdaptController object */
  retval = SUNAdaptController_Space(C, &lenrw, &leniw);
  if (retval == SUN_SUCCESS)
  {
    ark_mem->liw += leniw;
    ark_mem->lrw += lenrw;
  }
  ark_mem->hadapt_mem->hcontroller   = C;
  ark_mem->hadapt_mem->owncontroller = SUNTRUE;

  return (ARK_SUCCESS);
}